

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

char * ImGui::TableGetColumnName(ImGuiTable *table,int column_n)

{
  short sVar1;
  char *pcVar2;
  uint uVar3;
  ImGuiTableColumn *pIVar4;
  
  pcVar2 = "";
  if ((table->IsLayoutLocked != false) || (column_n < table->DeclColumnsCount)) {
    if ((column_n < 0) ||
       (pIVar4 = (table->Columns).Data + column_n, (table->Columns).DataEnd <= pIVar4)) {
      __assert_fail("p >= Data && p < DataEnd",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_internal.h"
                    ,0x24b,
                    "const T &ImSpan<ImGuiTableColumn>::operator[](int) const [T = ImGuiTableColumn]"
                   );
    }
    sVar1 = pIVar4->NameOffset;
    uVar3 = (uint)sVar1;
    if (uVar3 != 0xffffffff) {
      if ((sVar1 < 0) || ((table->ColumnsNames).Buf.Size <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.h"
                      ,0x707,"const T &ImVector<char>::operator[](int) const [T = char]");
      }
      pcVar2 = (table->ColumnsNames).Buf.Data + uVar3;
    }
  }
  return pcVar2;
}

Assistant:

const char* ImGui::TableGetColumnName(const ImGuiTable* table, int column_n)
{
    if (table->IsLayoutLocked == false && column_n >= table->DeclColumnsCount)
        return ""; // NameOffset is invalid at this point
    const ImGuiTableColumn* column = &table->Columns[column_n];
    if (column->NameOffset == -1)
        return "";
    return &table->ColumnsNames.Buf[column->NameOffset];
}